

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O1

Token * __thiscall wabt::WastLexer::GetReservedToken(Token *__return_storage_ptr__,WastLexer *this)

{
  byte *pbVar1;
  long lVar2;
  
  pbVar1 = (byte *)this->cursor_;
  do {
    if (pbVar1 < this->buffer_end_) {
      lVar2 = (ulong)*pbVar1 + 1;
    }
    else {
      lVar2 = 0;
    }
    do {
      if ((""[lVar2] & 1U) == 0) {
        TextToken(__return_storage_ptr__,this,Reserved,0);
        return __return_storage_ptr__;
      }
      lVar2 = 0;
    } while (this->buffer_end_ <= pbVar1);
    pbVar1 = pbVar1 + 1;
    this->cursor_ = (char *)pbVar1;
  } while( true );
}

Assistant:

Token WastLexer::GetReservedToken() {
  ReadReservedChars();
  return TextToken(TokenType::Reserved);
}